

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

FieldDef * __thiscall
flatbuffers::Parser::AddField(Parser *this,StructDef *struct_def,string *name,Type *type)

{
  undefined8 uVar1;
  bool bVar2;
  voffset_t vVar3;
  FieldDef *this_00;
  size_type sVar4;
  unsigned_long *puVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  size_t local_50;
  size_t alignment;
  size_t size;
  FieldDef *local_30;
  FieldDef *field;
  Type *type_local;
  string *name_local;
  StructDef *struct_def_local;
  Parser *this_local;
  
  field = (FieldDef *)type;
  type_local = (Type *)name;
  name_local = (string *)struct_def;
  struct_def_local = (StructDef *)this;
  this_00 = (FieldDef *)operator_new(0xe0);
  FieldDef::FieldDef(this_00);
  local_30 = this_00;
  sVar4 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::size
                    ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                     (name_local + 6));
  vVar3 = FieldIndexToOffset((voffset_t)sVar4);
  (local_30->value).offset = (uint)vVar3;
  std::__cxx11::string::operator=((string *)local_30,(string *)type_local);
  uVar1 = *(undefined8 *)&(field->super_Definition).name;
  (local_30->value).type.base_type = (int)uVar1;
  (local_30->value).type.element = (int)((ulong)uVar1 >> 0x20);
  (local_30->value).type.struct_def = (StructDef *)(field->super_Definition).name._M_string_length;
  (local_30->value).type.enum_def =
       (EnumDef *)(field->super_Definition).name.field_2._M_allocated_capacity;
  if ((name_local[6].field_2._M_local_buf[8] & 1U) != 0) {
    alignment = InlineSize((Type *)field);
    local_50 = InlineAlignment((Type *)field);
    puVar5 = std::max<unsigned_long>((unsigned_long *)(name_local + 7),&local_50);
    *(unsigned_long *)(name_local + 7) = *puVar5;
    StructDef::PadLastField((StructDef *)name_local,local_50);
    (local_30->value).offset = (int)name_local[7]._M_string_length;
    name_local[7]._M_string_length = alignment + name_local[7]._M_string_length;
  }
  bVar2 = SymbolTable<flatbuffers::FieldDef>::Add
                    ((SymbolTable<flatbuffers::FieldDef> *)&name_local[4].field_2,
                     (string *)type_local,local_30);
  if (bVar2) {
    std::operator+(&local_70,"field already exists: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)type_local);
    Error(&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return local_30;
}

Assistant:

FieldDef &Parser::AddField(StructDef &struct_def,
                           const std::string &name,
                           const Type &type) {
  auto &field = *new FieldDef();
  field.value.offset =
    FieldIndexToOffset(static_cast<voffset_t>(struct_def.fields.vec.size()));
  field.name = name;
  field.value.type = type;
  if (struct_def.fixed) {  // statically compute the field offset
    auto size = InlineSize(type);
    auto alignment = InlineAlignment(type);
    // structs_ need to have a predictable format, so we need to align to
    // the largest scalar
    struct_def.minalign = std::max(struct_def.minalign, alignment);
    struct_def.PadLastField(alignment);
    field.value.offset = static_cast<uoffset_t>(struct_def.bytesize);
    struct_def.bytesize += size;
  }
  if (struct_def.fields.Add(name, &field))
    Error("field already exists: " + name);
  return field;
}